

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int64_t lj_carith_powi64(int64_t x,int64_t k)

{
  int iVar1;
  ulong in_RSI;
  uint64_t in_RDI;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = 1;
  }
  else if ((long)in_RSI < 0) {
    if (in_RDI == 0) {
      local_8 = 0x7fffffffffffffff;
    }
    else if (in_RDI == 1) {
      local_8 = 1;
    }
    else if (in_RDI == 0xffffffffffffffff) {
      iVar1 = 1;
      if ((in_RSI & 1) != 0) {
        iVar1 = -1;
      }
      local_8 = (uint64_t)iVar1;
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = lj_carith_powu64(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

int64_t lj_carith_powi64(int64_t x, int64_t k)
{
  if (k == 0)
    return 1;
  if (k < 0) {
    if (x == 0)
      return U64x(7fffffff,ffffffff);
    else if (x == 1)
      return 1;
    else if (x == -1)
      return (k & 1) ? -1 : 1;
    else
      return 0;
  }
  return (int64_t)lj_carith_powu64((uint64_t)x, (uint64_t)k);
}